

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  short sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  parasail_result_t *ppVar14;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  ulong uVar15;
  uint uVar16;
  int16_t iVar17;
  __m128i *palVar18;
  int32_t segNum;
  int iVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  undefined2 uVar30;
  ulong uVar31;
  long lVar32;
  undefined4 uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  __m128i alVar42;
  undefined1 auVar43 [16];
  ushort uVar44;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  short sVar53;
  short sVar60;
  short sVar61;
  short sVar62;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar64 [16];
  ushort uVar65;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  undefined1 auVar66 [16];
  ushort uVar73;
  __m128i_16_t e;
  __m128i_16_t h;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar33;
  short sVar38;
  undefined1 auVar56 [16];
  short sVar63;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_scan_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_table_scan_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_scan_profile_sse2_128_16_cold_6();
      }
      else {
        uVar16 = profile->s1Len;
        if ((int)uVar16 < 1) {
          parasail_nw_table_scan_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_scan_profile_sse2_128_16_cold_4();
        }
        else {
          uVar31 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_scan_profile_sse2_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_scan_profile_sse2_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_scan_profile_sse2_128_16_cold_1();
          }
          else {
            iVar11 = uVar16 - 1;
            uVar29 = (ulong)uVar16 + 7 >> 3;
            iVar28 = (int)uVar29;
            iVar27 = -open;
            iVar19 = ppVar4->min;
            iVar22 = -iVar19;
            if (iVar19 != iVar27 && SBORROW4(iVar19,iVar27) == iVar19 + open < 0) {
              iVar22 = open;
            }
            iVar10 = ppVar4->max;
            ppVar14 = parasail_result_new_table1((uint)((ulong)uVar16 + 7) & 0x7ffffff8,s2Len);
            if (ppVar14 != (parasail_result_t *)0x0) {
              ppVar14->flag = ppVar14->flag | 0x8220401;
              ptr = parasail_memalign___m128i(0x10,uVar29);
              ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m128i(0x10,uVar29);
              ptr_02 = parasail_memalign___m128i(0x10,uVar29);
              ptr_03 = parasail_memalign___m128i(0x10,uVar29);
              if (ptr_03 != (__m128i *)0x0 &&
                  ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                  (ptr_00 != (int16_t *)0x0 && ptr != (__m128i *)0x0))) {
                iVar12 = s2Len + -1;
                iVar13 = 7 - iVar11 / iVar28;
                auVar35 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar34 = auVar35._0_4_;
                auVar40._4_4_ = uVar34;
                auVar40._0_4_ = uVar34;
                auVar40._8_4_ = uVar34;
                auVar40._12_4_ = uVar34;
                auVar35 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar34 = auVar35._0_4_;
                uVar16 = iVar22 - 0x7fff;
                auVar35 = pshuflw(ZEXT416(uVar16),ZEXT416(uVar16),0);
                auVar36._0_4_ = auVar35._0_4_;
                auVar36._4_4_ = auVar36._0_4_;
                auVar36._8_4_ = auVar36._0_4_;
                auVar36._12_4_ = auVar36._0_4_;
                auVar39 = ZEXT416(CONCAT22((short)((uint)iVar19 >> 0x10),0x7ffe - (short)iVar10));
                auVar39 = pshuflw(auVar39,auVar39,0);
                auVar49._0_4_ = auVar39._0_4_;
                auVar49._4_4_ = auVar49._0_4_;
                auVar49._8_4_ = auVar49._0_4_;
                auVar49._12_4_ = auVar49._0_4_;
                auVar41 = pshuflw(ZEXT416((uint)-(iVar28 * gap)),ZEXT416((uint)-(iVar28 * gap)),0);
                uVar23 = auVar41._0_4_;
                auVar41._0_8_ = CONCAT44(uVar23,uVar23);
                auVar41._8_4_ = uVar23;
                auVar41._12_4_ = uVar23;
                auVar66._0_8_ = auVar41._0_8_ << 0x10;
                auVar66._8_8_ = auVar41._8_8_ << 0x10 | (ulong)(uVar23 >> 0x10);
                auVar41 = paddsw(auVar66,ZEXT416(uVar16 & 0xffff));
                lVar24 = (long)iVar27;
                uVar25 = 0;
                do {
                  lVar20 = 0;
                  lVar26 = lVar24;
                  do {
                    uVar30 = 0x8000;
                    if (-0x8000 < lVar26) {
                      uVar30 = (undefined2)lVar26;
                    }
                    *(undefined2 *)((long)&local_48 + lVar20 * 2) = uVar30;
                    lVar32 = lVar26 - (ulong)(uint)open;
                    if (lVar32 < -0x7fff) {
                      lVar32 = -0x8000;
                    }
                    *(short *)((long)&local_58 + lVar20 * 2) = (short)lVar32;
                    lVar20 = lVar20 + 1;
                    lVar26 = lVar26 - uVar29 * (uint)gap;
                  } while (lVar20 != 8);
                  ptr_02[uVar25][0] = local_48;
                  ptr_02[uVar25][1] = lStack_40;
                  ptr[uVar25][0] = local_58;
                  ptr[uVar25][1] = lStack_50;
                  uVar25 = uVar25 + 1;
                  lVar24 = lVar24 - (ulong)(uint)gap;
                } while (uVar25 != uVar29);
                *ptr_00 = 0;
                uVar25 = 1;
                do {
                  iVar17 = -0x8000;
                  if (-0x8000 < iVar27) {
                    iVar17 = (int16_t)iVar27;
                  }
                  ptr_00[uVar25] = iVar17;
                  uVar25 = uVar25 + 1;
                  iVar27 = iVar27 - gap;
                } while (s2Len + 1 != uVar25);
                alVar42 = (__m128i)psubsw((undefined1  [16])0x0,auVar40);
                palVar18 = ptr_03 + (iVar28 - 1U);
                uVar25 = uVar29;
                do {
                  *palVar18 = alVar42;
                  auVar43._4_4_ = uVar34;
                  auVar43._0_4_ = uVar34;
                  auVar43._8_4_ = uVar34;
                  auVar43._12_4_ = uVar34;
                  alVar42 = (__m128i)psubsw((undefined1  [16])alVar42,auVar43);
                  palVar18 = palVar18 + -1;
                  iVar19 = (int)uVar25;
                  uVar23 = iVar19 - 1;
                  uVar25 = (ulong)uVar23;
                } while (uVar23 != 0 && 0 < iVar19);
                uVar25 = 1;
                if (1 < s2Len) {
                  uVar25 = uVar31;
                }
                lVar20 = (ulong)(iVar28 + (uint)(iVar28 == 0)) << 4;
                lVar26 = uVar29 * uVar31;
                lVar24 = 0;
                uVar15 = 0;
                auVar59 = auVar36;
                do {
                  uVar9 = ptr_02[iVar28 - 1U][0];
                  auVar46._8_8_ = ptr_02[iVar28 - 1U][1] << 0x10 | uVar9 >> 0x30;
                  auVar46._0_8_ = uVar9 << 0x10 | (ulong)(ushort)ptr_00[uVar15];
                  iVar19 = ppVar4->mapper[(byte)s2[uVar15]];
                  auVar45 = psubsw(auVar36,(undefined1  [16])*ptr_03);
                  lVar32 = 0;
                  auVar66 = auVar36;
                  do {
                    auVar43 = *(undefined1 (*) [16])((long)*ptr_02 + lVar32);
                    auVar64 = paddsw(auVar46,*(undefined1 (*) [16])
                                              ((long)pvVar3 + lVar32 + (long)iVar19 * uVar29 * 0x10)
                                    );
                    auVar46 = paddsw(auVar45,*(undefined1 (*) [16])((long)*ptr_03 + lVar32));
                    auVar7._4_4_ = uVar34;
                    auVar7._0_4_ = uVar34;
                    auVar7._8_4_ = uVar34;
                    auVar7._12_4_ = uVar34;
                    auVar45 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar32),auVar7);
                    sVar33 = auVar46._0_2_;
                    sVar38 = auVar66._0_2_;
                    auVar54._0_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar46._2_2_;
                    sVar38 = auVar66._2_2_;
                    auVar54._2_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar46._4_2_;
                    sVar38 = auVar66._4_2_;
                    auVar54._4_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar46._6_2_;
                    sVar38 = auVar66._6_2_;
                    auVar54._6_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar46._8_2_;
                    sVar38 = auVar66._8_2_;
                    auVar54._8_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar46._10_2_;
                    sVar38 = auVar66._10_2_;
                    auVar54._10_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar46._12_2_;
                    sVar38 = auVar66._12_2_;
                    sVar63 = auVar66._14_2_;
                    auVar54._12_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar46._14_2_;
                    auVar54._14_2_ =
                         (ushort)(sVar63 < sVar33) * sVar33 | (ushort)(sVar63 >= sVar33) * sVar63;
                    auVar66 = psubsw(auVar43,auVar40);
                    sVar33 = auVar45._0_2_;
                    sVar38 = auVar66._0_2_;
                    uVar65 = (ushort)(sVar38 < sVar33) * sVar33 |
                             (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar45._2_2_;
                    sVar38 = auVar66._2_2_;
                    uVar67 = (ushort)(sVar38 < sVar33) * sVar33 |
                             (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar45._4_2_;
                    sVar38 = auVar66._4_2_;
                    uVar68 = (ushort)(sVar38 < sVar33) * sVar33 |
                             (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar45._6_2_;
                    sVar38 = auVar66._6_2_;
                    uVar69 = (ushort)(sVar38 < sVar33) * sVar33 |
                             (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar45._8_2_;
                    sVar38 = auVar66._8_2_;
                    uVar70 = (ushort)(sVar38 < sVar33) * sVar33 |
                             (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar45._10_2_;
                    sVar38 = auVar66._10_2_;
                    uVar71 = (ushort)(sVar38 < sVar33) * sVar33 |
                             (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar45._12_2_;
                    sVar38 = auVar66._12_2_;
                    sVar63 = auVar66._14_2_;
                    uVar72 = (ushort)(sVar38 < sVar33) * sVar33 |
                             (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar45._14_2_;
                    uVar73 = (ushort)(sVar63 < sVar33) * sVar33 |
                             (ushort)(sVar63 >= sVar33) * sVar63;
                    sVar33 = auVar64._0_2_;
                    uVar44 = (sVar33 < (short)uVar65) * uVar65 |
                             (ushort)(sVar33 >= (short)uVar65) * sVar33;
                    sVar33 = auVar64._2_2_;
                    uVar50 = (sVar33 < (short)uVar67) * uVar67 |
                             (ushort)(sVar33 >= (short)uVar67) * sVar33;
                    sVar33 = auVar64._4_2_;
                    uVar51 = (sVar33 < (short)uVar68) * uVar68 |
                             (ushort)(sVar33 >= (short)uVar68) * sVar33;
                    sVar33 = auVar64._6_2_;
                    uVar52 = (sVar33 < (short)uVar69) * uVar69 |
                             (ushort)(sVar33 >= (short)uVar69) * sVar33;
                    auVar45._0_8_ = CONCAT26(uVar52,CONCAT24(uVar51,CONCAT22(uVar50,uVar44)));
                    sVar33 = auVar64._8_2_;
                    auVar45._8_2_ =
                         (sVar33 < (short)uVar70) * uVar70 |
                         (ushort)(sVar33 >= (short)uVar70) * sVar33;
                    sVar33 = auVar64._10_2_;
                    auVar45._10_2_ =
                         (sVar33 < (short)uVar71) * uVar71 |
                         (ushort)(sVar33 >= (short)uVar71) * sVar33;
                    sVar33 = auVar64._12_2_;
                    sVar38 = auVar64._14_2_;
                    auVar45._12_2_ =
                         (sVar33 < (short)uVar72) * uVar72 |
                         (ushort)(sVar33 >= (short)uVar72) * sVar33;
                    auVar45._14_2_ =
                         (sVar38 < (short)uVar73) * uVar73 |
                         (ushort)(sVar38 >= (short)uVar73) * sVar38;
                    puVar1 = (ushort *)((long)*ptr + lVar32);
                    *puVar1 = uVar65;
                    puVar1[1] = uVar67;
                    puVar1[2] = uVar68;
                    puVar1[3] = uVar69;
                    puVar1[4] = uVar70;
                    puVar1[5] = uVar71;
                    puVar1[6] = uVar72;
                    puVar1[7] = uVar73;
                    *(undefined1 (*) [16])((long)*ptr_01 + lVar32) = auVar45;
                    lVar32 = lVar32 + 0x10;
                    auVar66 = auVar54;
                    auVar46 = auVar43;
                  } while (lVar20 != lVar32);
                  auVar47._8_8_ = auVar45._8_8_ << 0x10 | (ulong)uVar52;
                  uVar65 = ptr_00[uVar15 + 1];
                  auVar47._0_8_ = auVar45._0_8_ << 0x10 | (ulong)uVar65;
                  uVar15 = uVar15 + 1;
                  auVar66 = paddsw((undefined1  [16])*ptr_03,auVar47);
                  sVar33 = auVar66._0_2_;
                  auVar64._0_2_ =
                       (ushort)((short)auVar54._0_2_ < sVar33) * sVar33 |
                       ((short)auVar54._0_2_ >= sVar33) * auVar54._0_2_;
                  sVar33 = auVar66._2_2_;
                  auVar64._2_2_ =
                       (ushort)((short)auVar54._2_2_ < sVar33) * sVar33 |
                       ((short)auVar54._2_2_ >= sVar33) * auVar54._2_2_;
                  sVar33 = auVar66._4_2_;
                  auVar64._4_2_ =
                       (ushort)((short)auVar54._4_2_ < sVar33) * sVar33 |
                       ((short)auVar54._4_2_ >= sVar33) * auVar54._4_2_;
                  sVar33 = auVar66._6_2_;
                  auVar64._6_2_ =
                       (ushort)((short)auVar54._6_2_ < sVar33) * sVar33 |
                       ((short)auVar54._6_2_ >= sVar33) * auVar54._6_2_;
                  sVar33 = auVar66._8_2_;
                  auVar64._8_2_ =
                       (ushort)((short)auVar54._8_2_ < sVar33) * sVar33 |
                       ((short)auVar54._8_2_ >= sVar33) * auVar54._8_2_;
                  sVar33 = auVar66._10_2_;
                  auVar64._10_2_ =
                       (ushort)((short)auVar54._10_2_ < sVar33) * sVar33 |
                       ((short)auVar54._10_2_ >= sVar33) * auVar54._10_2_;
                  sVar33 = auVar66._12_2_;
                  auVar64._12_2_ =
                       (ushort)((short)auVar54._12_2_ < sVar33) * sVar33 |
                       ((short)auVar54._12_2_ >= sVar33) * auVar54._12_2_;
                  sVar33 = auVar66._14_2_;
                  auVar64._14_2_ =
                       (ushort)((short)auVar54._14_2_ < sVar33) * sVar33 |
                       ((short)auVar54._14_2_ >= sVar33) * auVar54._14_2_;
                  iVar19 = 6;
                  do {
                    auVar55._0_8_ = auVar64._0_8_ << 0x10;
                    auVar55._8_8_ = auVar64._8_8_ << 0x10 | auVar64._0_8_ >> 0x30;
                    auVar66 = paddsw(auVar55,auVar41);
                    sVar33 = auVar64._0_2_;
                    sVar53 = auVar66._0_2_;
                    sVar38 = auVar64._2_2_;
                    sVar60 = auVar66._2_2_;
                    sVar63 = auVar64._4_2_;
                    sVar61 = auVar66._4_2_;
                    sVar6 = auVar64._6_2_;
                    sVar62 = auVar66._6_2_;
                    uVar67 = (ushort)(sVar62 < sVar6) * sVar6 | (ushort)(sVar62 >= sVar6) * sVar62;
                    auVar56._0_8_ =
                         CONCAT26(uVar67,CONCAT24((ushort)(sVar61 < sVar63) * sVar63 |
                                                  (ushort)(sVar61 >= sVar63) * sVar61,
                                                  CONCAT22((ushort)(sVar60 < sVar38) * sVar38 |
                                                           (ushort)(sVar60 >= sVar38) * sVar60,
                                                           (ushort)(sVar53 < sVar33) * sVar33 |
                                                           (ushort)(sVar53 >= sVar33) * sVar53)));
                    sVar33 = auVar64._8_2_;
                    sVar38 = auVar66._8_2_;
                    auVar56._8_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar64._10_2_;
                    sVar38 = auVar66._10_2_;
                    auVar56._10_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar64._12_2_;
                    sVar38 = auVar66._12_2_;
                    sVar63 = auVar66._14_2_;
                    auVar56._12_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar64._14_2_;
                    auVar56._14_2_ =
                         (ushort)(sVar63 < sVar33) * sVar33 | (ushort)(sVar63 >= sVar33) * sVar63;
                    iVar19 = iVar19 + -1;
                    auVar64 = auVar56;
                  } while (iVar19 != 0);
                  auVar57._0_8_ = auVar56._0_8_ << 0x10;
                  auVar57._8_8_ = auVar56._8_8_ << 0x10 | (ulong)uVar67;
                  auVar58 = paddsw(auVar57,ZEXT416(uVar16 & 0xffff));
                  sVar33 = auVar58._0_2_;
                  auVar48._0_2_ =
                       (ushort)((short)uVar65 < sVar33) * sVar33 |
                       ((short)uVar65 >= sVar33) * uVar65;
                  sVar33 = auVar58._2_2_;
                  auVar48._2_2_ =
                       (ushort)((short)uVar44 < sVar33) * sVar33 |
                       ((short)uVar44 >= sVar33) * uVar44;
                  sVar33 = auVar58._4_2_;
                  auVar48._4_2_ =
                       (ushort)((short)uVar50 < sVar33) * sVar33 |
                       ((short)uVar50 >= sVar33) * uVar50;
                  sVar33 = auVar58._6_2_;
                  auVar48._6_2_ =
                       (ushort)((short)uVar51 < sVar33) * sVar33 |
                       ((short)uVar51 >= sVar33) * uVar51;
                  sVar33 = auVar58._8_2_;
                  auVar48._8_2_ =
                       (ushort)((short)uVar52 < sVar33) * sVar33 |
                       ((short)uVar52 >= sVar33) * uVar52;
                  sVar33 = auVar58._10_2_;
                  auVar48._10_2_ =
                       (ushort)((short)auVar45._8_2_ < sVar33) * sVar33 |
                       ((short)auVar45._8_2_ >= sVar33) * auVar45._8_2_;
                  sVar33 = auVar58._12_2_;
                  auVar48._12_2_ =
                       (ushort)((short)auVar45._10_2_ < sVar33) * sVar33 |
                       ((short)auVar45._10_2_ >= sVar33) * auVar45._10_2_;
                  sVar33 = auVar58._14_2_;
                  auVar48._14_2_ =
                       (ushort)((short)auVar45._12_2_ < sVar33) * sVar33 |
                       ((short)auVar45._12_2_ >= sVar33) * auVar45._12_2_;
                  lVar21 = 0;
                  lVar32 = lVar24;
                  auVar66 = auVar59;
                  auVar43 = auVar49;
                  do {
                    auVar8._4_4_ = uVar34;
                    auVar8._0_4_ = uVar34;
                    auVar8._8_4_ = uVar34;
                    auVar8._12_4_ = uVar34;
                    auVar59 = psubsw(auVar58,auVar8);
                    auVar49 = psubsw(auVar48,auVar40);
                    sVar33 = auVar49._0_2_;
                    sVar38 = auVar59._0_2_;
                    auVar58._0_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar49._2_2_;
                    sVar38 = auVar59._2_2_;
                    auVar58._2_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar49._4_2_;
                    sVar38 = auVar59._4_2_;
                    auVar58._4_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar49._6_2_;
                    sVar38 = auVar59._6_2_;
                    auVar58._6_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar49._8_2_;
                    sVar38 = auVar59._8_2_;
                    auVar58._8_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar49._10_2_;
                    sVar38 = auVar59._10_2_;
                    auVar58._10_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar49._12_2_;
                    sVar38 = auVar59._12_2_;
                    sVar63 = auVar59._14_2_;
                    auVar58._12_2_ =
                         (ushort)(sVar38 < sVar33) * sVar33 | (ushort)(sVar38 >= sVar33) * sVar38;
                    sVar33 = auVar49._14_2_;
                    auVar58._14_2_ =
                         (ushort)(sVar63 < sVar33) * sVar33 | (ushort)(sVar63 >= sVar33) * sVar63;
                    psVar2 = (short *)((long)*ptr_01 + lVar21);
                    sVar33 = *psVar2;
                    sVar38 = psVar2[1];
                    sVar63 = psVar2[2];
                    sVar6 = psVar2[3];
                    sVar53 = psVar2[4];
                    sVar60 = psVar2[5];
                    sVar61 = psVar2[6];
                    sVar62 = psVar2[7];
                    auVar48._0_2_ =
                         (sVar33 < (short)auVar58._0_2_) * auVar58._0_2_ |
                         (ushort)(sVar33 >= (short)auVar58._0_2_) * sVar33;
                    auVar48._2_2_ =
                         (sVar38 < (short)auVar58._2_2_) * auVar58._2_2_ |
                         (ushort)(sVar38 >= (short)auVar58._2_2_) * sVar38;
                    auVar48._4_2_ =
                         (sVar63 < (short)auVar58._4_2_) * auVar58._4_2_ |
                         (ushort)(sVar63 >= (short)auVar58._4_2_) * sVar63;
                    auVar48._6_2_ =
                         (sVar6 < (short)auVar58._6_2_) * auVar58._6_2_ |
                         (ushort)(sVar6 >= (short)auVar58._6_2_) * sVar6;
                    auVar48._8_2_ =
                         (sVar53 < (short)auVar58._8_2_) * auVar58._8_2_ |
                         (ushort)(sVar53 >= (short)auVar58._8_2_) * sVar53;
                    auVar48._10_2_ =
                         (sVar60 < (short)auVar58._10_2_) * auVar58._10_2_ |
                         (ushort)(sVar60 >= (short)auVar58._10_2_) * sVar60;
                    auVar48._12_2_ =
                         (sVar61 < (short)auVar58._12_2_) * auVar58._12_2_ |
                         (ushort)(sVar61 >= (short)auVar58._12_2_) * sVar61;
                    auVar48._14_2_ =
                         (sVar62 < (short)auVar58._14_2_) * auVar58._14_2_ |
                         (ushort)(sVar62 >= (short)auVar58._14_2_) * sVar62;
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar21) = auVar48;
                    piVar5 = ((ppVar14->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + lVar32) = (int)(short)auVar48._0_2_;
                    *(int *)((long)piVar5 + lVar26 * 4 + lVar32) = (int)(short)auVar48._2_2_;
                    *(int *)((long)piVar5 + lVar26 * 8 + lVar32) = (int)(short)auVar48._4_2_;
                    *(int *)((long)piVar5 + lVar26 * 0xc + lVar32) = (int)(short)auVar48._6_2_;
                    *(int *)((long)piVar5 + lVar26 * 0x10 + lVar32) = (int)(short)auVar48._8_2_;
                    *(int *)((long)piVar5 + lVar26 * 0x14 + lVar32) = (int)(short)auVar48._10_2_;
                    *(int *)((long)piVar5 + lVar26 * 0x18 + lVar32) = (int)(short)auVar48._12_2_;
                    *(int *)((long)piVar5 + lVar26 * 0x1c + lVar32) = (int)(short)auVar48._14_2_;
                    sVar33 = auVar43._0_2_;
                    auVar49._0_2_ =
                         ((short)auVar48._0_2_ < sVar33) * auVar48._0_2_ |
                         (ushort)((short)auVar48._0_2_ >= sVar33) * sVar33;
                    sVar33 = auVar43._2_2_;
                    auVar49._2_2_ =
                         ((short)auVar48._2_2_ < sVar33) * auVar48._2_2_ |
                         (ushort)((short)auVar48._2_2_ >= sVar33) * sVar33;
                    sVar33 = auVar43._4_2_;
                    auVar49._4_2_ =
                         ((short)auVar48._4_2_ < sVar33) * auVar48._4_2_ |
                         (ushort)((short)auVar48._4_2_ >= sVar33) * sVar33;
                    sVar33 = auVar43._6_2_;
                    auVar49._6_2_ =
                         ((short)auVar48._6_2_ < sVar33) * auVar48._6_2_ |
                         (ushort)((short)auVar48._6_2_ >= sVar33) * sVar33;
                    sVar33 = auVar43._8_2_;
                    auVar49._8_2_ =
                         ((short)auVar48._8_2_ < sVar33) * auVar48._8_2_ |
                         (ushort)((short)auVar48._8_2_ >= sVar33) * sVar33;
                    sVar33 = auVar43._10_2_;
                    auVar49._10_2_ =
                         ((short)auVar48._10_2_ < sVar33) * auVar48._10_2_ |
                         (ushort)((short)auVar48._10_2_ >= sVar33) * sVar33;
                    sVar33 = auVar43._12_2_;
                    sVar38 = auVar43._14_2_;
                    auVar49._12_2_ =
                         ((short)auVar48._12_2_ < sVar33) * auVar48._12_2_ |
                         (ushort)((short)auVar48._12_2_ >= sVar33) * sVar33;
                    auVar49._14_2_ =
                         ((short)auVar48._14_2_ < sVar38) * auVar48._14_2_ |
                         (ushort)((short)auVar48._14_2_ >= sVar38) * sVar38;
                    sVar33 = auVar66._0_2_;
                    auVar59._0_2_ =
                         (sVar33 < (short)auVar48._0_2_) * auVar48._0_2_ |
                         (ushort)(sVar33 >= (short)auVar48._0_2_) * sVar33;
                    sVar33 = auVar66._2_2_;
                    auVar59._2_2_ =
                         (sVar33 < (short)auVar48._2_2_) * auVar48._2_2_ |
                         (ushort)(sVar33 >= (short)auVar48._2_2_) * sVar33;
                    sVar33 = auVar66._4_2_;
                    auVar59._4_2_ =
                         (sVar33 < (short)auVar48._4_2_) * auVar48._4_2_ |
                         (ushort)(sVar33 >= (short)auVar48._4_2_) * sVar33;
                    sVar33 = auVar66._6_2_;
                    auVar59._6_2_ =
                         (sVar33 < (short)auVar48._6_2_) * auVar48._6_2_ |
                         (ushort)(sVar33 >= (short)auVar48._6_2_) * sVar33;
                    sVar33 = auVar66._8_2_;
                    auVar59._8_2_ =
                         (sVar33 < (short)auVar48._8_2_) * auVar48._8_2_ |
                         (ushort)(sVar33 >= (short)auVar48._8_2_) * sVar33;
                    sVar33 = auVar66._10_2_;
                    auVar59._10_2_ =
                         (sVar33 < (short)auVar48._10_2_) * auVar48._10_2_ |
                         (ushort)(sVar33 >= (short)auVar48._10_2_) * sVar33;
                    sVar33 = auVar66._12_2_;
                    sVar38 = auVar66._14_2_;
                    auVar59._12_2_ =
                         (sVar33 < (short)auVar48._12_2_) * auVar48._12_2_ |
                         (ushort)(sVar33 >= (short)auVar48._12_2_) * sVar33;
                    auVar59._14_2_ =
                         (sVar38 < (short)auVar48._14_2_) * auVar48._14_2_ |
                         (ushort)(sVar38 >= (short)auVar48._14_2_) * sVar38;
                    lVar21 = lVar21 + 0x10;
                    lVar32 = lVar32 + uVar31 * 4;
                    auVar66 = auVar59;
                    auVar43 = auVar49;
                  } while (lVar20 != lVar21);
                  lVar24 = lVar24 + 4;
                } while (uVar15 != uVar25);
                uVar31 = ptr_02[(uint)(iVar11 % iVar28)][0];
                uVar29 = ptr_02[(uint)(iVar11 % iVar28)][1];
                if (iVar11 / iVar28 < 7) {
                  iVar19 = 1;
                  if (1 < iVar13) {
                    iVar19 = iVar13;
                  }
                  do {
                    uVar29 = uVar29 << 0x10 | uVar31 >> 0x30;
                    iVar19 = iVar19 + -1;
                    uVar31 = uVar31 << 0x10;
                  } while (iVar19 != 0);
                }
                sVar33 = auVar35._0_2_;
                auVar37._0_2_ = -(ushort)((short)auVar49._0_2_ < sVar33);
                sVar38 = auVar35._2_2_;
                auVar37._2_2_ = -(ushort)((short)auVar49._2_2_ < sVar38);
                auVar37._4_2_ = -(ushort)((short)auVar49._4_2_ < sVar33);
                auVar37._6_2_ = -(ushort)((short)auVar49._6_2_ < sVar38);
                auVar37._8_2_ = -(ushort)((short)auVar49._8_2_ < sVar33);
                auVar37._10_2_ = -(ushort)((short)auVar49._10_2_ < sVar38);
                auVar37._12_2_ = -(ushort)((short)auVar49._12_2_ < sVar33);
                auVar37._14_2_ = -(ushort)((short)auVar49._14_2_ < sVar38);
                sVar33 = auVar39._0_2_;
                auVar35._0_2_ = -(ushort)(sVar33 < (short)auVar59._0_2_);
                sVar38 = auVar39._2_2_;
                auVar35._2_2_ = -(ushort)(sVar38 < (short)auVar59._2_2_);
                auVar35._4_2_ = -(ushort)(sVar33 < (short)auVar59._4_2_);
                auVar35._6_2_ = -(ushort)(sVar38 < (short)auVar59._6_2_);
                auVar35._8_2_ = -(ushort)(sVar33 < (short)auVar59._8_2_);
                auVar35._10_2_ = -(ushort)(sVar38 < (short)auVar59._10_2_);
                auVar35._12_2_ = -(ushort)(sVar33 < (short)auVar59._12_2_);
                auVar35._14_2_ = -(ushort)(sVar38 < (short)auVar59._14_2_);
                auVar35 = auVar35 | auVar37;
                if ((((((((((((((((auVar35 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                 (auVar35 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && (auVar35 >> 0x17 & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                               (auVar35 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar35 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                             && (auVar35 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                            && (auVar35 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                           && (auVar35 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar35 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar35 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar35 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar35 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar35 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar35 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar35 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar35[0xf]) {
                  sVar33 = (short)(uVar29 >> 0x30);
                }
                else {
                  *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                  sVar33 = 0;
                  iVar12 = 0;
                  iVar11 = 0;
                }
                ppVar14->score = (int)sVar33;
                ppVar14->end_query = iVar11;
                ppVar14->end_ref = iVar12;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar14;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}